

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

Instr * __thiscall LowererMD::LowerTry(LowererMD *this,Instr *tryInstr,JnHelperMethod helperMethod)

{
  code *pcVar1;
  IRKind IVar2;
  bool bVar3;
  RegNum RVar4;
  Instr *pIVar5;
  undefined4 *puVar6;
  LabelInstr *labelInstr;
  IntConstOpnd *opndArg;
  RegOpnd *pRVar7;
  BranchInstr *this_00;
  LabelInstr *labelInstr_00;
  LabelOpnd *pLVar8;
  StackSym *pSVar9;
  HelperCallOpnd *src1Opnd;
  MultiBranchInstr *instr_00;
  bool local_89;
  BranchInstr *branchInstr;
  Instr *nop;
  Instr *callInstr;
  RegOpnd *continuationAddr;
  LabelInstr *helperAddr;
  RegOpnd *ebpOpnd;
  RegOpnd *spillSizeOpnd;
  RegOpnd *argsSizeOpnd;
  Opnd *hasBailedOutOffset;
  LabelInstr *tryAddr;
  Instr *instr;
  JnHelperMethod helperMethod_local;
  Instr *tryInstr_local;
  LowererMD *this_local;
  
  pIVar5 = IR::Instr::GetNextRealInstrOrLabel(tryInstr);
  IVar2 = IR::Instr::GetKind(pIVar5);
  local_89 = true;
  if (IVar2 != InstrKindLabel) {
    local_89 = IR::Instr::IsProfiledLabelInstr(pIVar5);
  }
  if (local_89 == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x189,"(instr->IsLabelInstr())","No label at the entry to a try?");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  labelInstr = IR::Instr::AsLabelInstr(pIVar5);
  Lowerer::LoadScriptContext(this->m_lowerer,&labelInstr->super_Instr);
  if (((tryInstr->m_opcode == TryCatch) || (bVar3 = Func::DoOptimizeTry(this->m_func), bVar3)) ||
     ((bVar3 = Func::IsSimpleJit(this->m_func), bVar3 &&
      ((*(uint *)&this->m_func->field_0x240 >> 4 & 1) != 0)))) {
    pSVar9 = Func::GetHasBailedOutSym(this->m_func);
    opndArg = IR::IntConstOpnd::New((long)pSVar9->m_offset,TyInt32,this->m_func,false);
    LoadHelperArgument(this,&labelInstr->super_Instr,&opndArg->super_Opnd);
  }
  pRVar7 = IR::RegOpnd::New(TyInt64,this->m_func);
  pIVar5 = IR::Instr::New(LdArgSize,&pRVar7->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&labelInstr->super_Instr,pIVar5);
  LoadHelperArgument(this,&labelInstr->super_Instr,&pRVar7->super_Opnd);
  pRVar7 = IR::RegOpnd::New(TyInt64,this->m_func);
  pIVar5 = IR::Instr::New(LdSpillSize,&pRVar7->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&labelInstr->super_Instr,pIVar5);
  LoadHelperArgument(this,&labelInstr->super_Instr,&pRVar7->super_Opnd);
  RVar4 = LowererMDArch::GetRegBlockPointer();
  pRVar7 = IR::RegOpnd::New((StackSym *)0x0,RVar4,TyInt64,this->m_func);
  LoadHelperArgument(this,&labelInstr->super_Instr,&pRVar7->super_Opnd);
  this_00 = IR::Instr::AsBranchInstr(tryInstr);
  labelInstr_00 = IR::BranchInstr::GetTarget(this_00);
  pLVar8 = IR::LabelOpnd::New(labelInstr_00,this->m_func);
  LoadHelperArgument(this,&labelInstr->super_Instr,&pLVar8->super_Opnd);
  pLVar8 = IR::LabelOpnd::New(labelInstr,this->m_func);
  LoadHelperArgument(this,&labelInstr->super_Instr,&pLVar8->super_Opnd);
  pSVar9 = StackSym::New(TyInt64,this->m_func);
  RVar4 = LowererMDArch::GetRegReturn(TyInt64);
  pRVar7 = IR::RegOpnd::New(pSVar9,RVar4,TyInt64,this->m_func);
  src1Opnd = IR::HelperCallOpnd::New(helperMethod,this->m_func);
  pIVar5 = IR::Instr::New(Call,&pRVar7->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&labelInstr->super_Instr,pIVar5);
  LowerCall(this,pIVar5,0);
  pIVar5 = IR::Instr::New(NOP,this->m_func);
  IR::Instr::InsertBefore(&labelInstr->super_Instr,pIVar5);
  instr_00 = IR::MultiBranchInstr::New(JMP,&pRVar7->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&labelInstr->super_Instr,(Instr *)instr_00);
  return tryInstr->m_prev;
}

Assistant:

IR::Instr *
LowererMD::LowerTry(IR::Instr *tryInstr, IR::JnHelperMethod helperMethod)
{
    // Mark the entry to the try
    IR::Instr *instr = tryInstr->GetNextRealInstrOrLabel();
    AssertMsg(instr->IsLabelInstr(), "No label at the entry to a try?");
    IR::LabelInstr *tryAddr = instr->AsLabelInstr();

    // Arg 5: ScriptContext
    this->m_lowerer->LoadScriptContext(tryAddr);

    if (tryInstr->m_opcode == Js::OpCode::TryCatch || (this->m_func->DoOptimizeTry() || (this->m_func->IsSimpleJit() && this->m_func->hasBailout)))
    {
        // Arg 4 : hasBailedOutOffset
        IR::Opnd * hasBailedOutOffset = IR::IntConstOpnd::New(this->m_func->GetHasBailedOutSym()->m_offset, TyInt32, this->m_func);
        this->LoadHelperArgument(tryAddr, hasBailedOutOffset);
    }
#ifdef _M_X64
    // Arg: args size
    IR::RegOpnd *argsSizeOpnd = IR::RegOpnd::New(TyMachReg, m_func);
    tryAddr->InsertBefore(IR::Instr::New(Js::OpCode::LdArgSize, argsSizeOpnd, this->m_func));
    this->LoadHelperArgument(tryAddr, argsSizeOpnd);

    // Arg: spill size
    IR::RegOpnd *spillSizeOpnd = IR::RegOpnd::New(TyMachReg, m_func);
    tryAddr->InsertBefore(IR::Instr::New(Js::OpCode::LdSpillSize, spillSizeOpnd, this->m_func));
    this->LoadHelperArgument(tryAddr, spillSizeOpnd);
#endif

    // Arg 3: frame pointer
    IR::RegOpnd *ebpOpnd = IR::RegOpnd::New(nullptr, lowererMDArch.GetRegBlockPointer(), TyMachReg, this->m_func);
    this->LoadHelperArgument(tryAddr, ebpOpnd);

    // Arg 2: handler address
    IR::LabelInstr *helperAddr = tryInstr->AsBranchInstr()->GetTarget();
    this->LoadHelperArgument(tryAddr, IR::LabelOpnd::New(helperAddr, this->m_func));

    // Arg 1: try address
    this->LoadHelperArgument(tryAddr, IR::LabelOpnd::New(tryAddr, this->m_func));

    // Call the helper
    IR::RegOpnd *continuationAddr =
        IR::RegOpnd::New(StackSym::New(TyMachReg, this->m_func), lowererMDArch.GetRegReturn(TyMachReg), TyMachReg, this->m_func);
    IR::Instr *callInstr = IR::Instr::New(
        Js::OpCode::Call, continuationAddr, IR::HelperCallOpnd::New(helperMethod, this->m_func), this->m_func);
    tryAddr->InsertBefore(callInstr);
    this->LowerCall(callInstr, 0);

#ifdef _M_X64
    {
        // Emit some instruction to separate the CALL from the JMP following it. The OS stack unwinder
        // mistakes the JMP for the start of the epilog otherwise.
        IR::Instr *nop = IR::Instr::New(Js::OpCode::NOP, m_func);
        tryAddr->InsertBefore(nop);
    }
#endif

    // Jump to the continuation address supplied by the helper
    IR::BranchInstr *branchInstr = IR::MultiBranchInstr::New(Js::OpCode::JMP, continuationAddr, this->m_func);
    tryAddr->InsertBefore(branchInstr);

    return tryInstr->m_prev;
}